

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiTextIndex::clear(ImGuiTextIndex *this)

{
  ImVector<int>::clear(&this->LineOffsets);
  this->EndOffset = 0;
  return;
}

Assistant:

void            clear()                                 { LineOffsets.clear(); EndOffset = 0; }